

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::LoopBodyStart<false,false>
          (InterpreterStackFrame *this,uint32 loopNumber,LayoutSize layoutSize,bool isFirstIteration
          )

{
  bool bVar1;
  ThreadContext *pTVar2;
  bool isFirstIteration_local;
  LayoutSize layoutSize_local;
  uint32 loopNumber_local;
  InterpreterStackFrame *this_local;
  
  bVar1 = ScriptContext::ShouldPerformRecordOrReplayDebuggerAction(*(ScriptContext **)(this + 0x78))
  ;
  if (bVar1) {
    pTVar2 = ScriptContext::GetThreadContext(*(ScriptContext **)(this + 0x78));
    TTD::ExecutionInfoManager::UpdateLoopCountInfo(pTVar2->TTDExecutionInfo);
  }
  return;
}

Assistant:

void InterpreterStackFrame::LoopBodyStart(uint32 loopNumber, LayoutSize layoutSize, bool isFirstIteration)
    {
        if (InterruptProbe)
        {
            this->DoInterruptProbe();
        }

#if ENABLE_TTD
        if (SHOULD_DO_TTD_STACK_STMT_OP(this->scriptContext))
        {
            this->scriptContext->GetThreadContext()->TTDExecutionInfo->UpdateLoopCountInfo();
        }
#endif

        if (!JITLoopBody || this->IsInCatchOrFinallyBlock())
        {
            // For functions having try-catch-finally, jit loop bodies for loops that are contained only in a try block,
            // not even indirect containment in a Catch or Finally.
            return;
        }

        DoLoopBodyStart(loopNumber, layoutSize, true, isFirstIteration);
    }